

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2pShaderCompilationCases.cpp
# Opt level: O3

int __thiscall
deqp::gles2::Performance::ShaderCompilerTextureCase::init
          (ShaderCompilerTextureCase *this,EVP_PKEY_CTX *ctx)

{
  pointer *pppTVar1;
  int iVar2;
  undefined4 extraout_var;
  Texture2D *this_00;
  iterator __position;
  Texture2D *tex;
  TextureFormatInfo fmtInfo;
  Texture2D *local_80;
  vector<glu::Texture2D*,std::allocator<glu::Texture2D*>> *local_78;
  TextureFormatInfo local_70;
  long lVar3;
  
  iVar2 = (*((this->super_ShaderCompilerCase).super_TestCase.m_context)->m_renderCtx->
            _vptr_RenderContext[3])();
  lVar3 = CONCAT44(extraout_var,iVar2);
  local_78 = (vector<glu::Texture2D*,std::allocator<glu::Texture2D*>> *)&this->m_textures;
  __position._M_current = (Texture2D **)(long)this->m_numLookups;
  std::vector<glu::Texture2D_*,_std::allocator<glu::Texture2D_*>_>::reserve
            ((vector<glu::Texture2D_*,_std::allocator<glu::Texture2D_*>_> *)local_78,
             (size_type)__position._M_current);
  if (0 < this->m_numLookups) {
    iVar2 = 0;
    do {
      this_00 = (Texture2D *)operator_new(0x70);
      glu::Texture2D::Texture2D
                (this_00,((this->super_ShaderCompilerCase).super_TestCase.m_context)->m_renderCtx,
                 0x1907,0x1401,0x40,0x40);
      local_80 = this_00;
      tcu::getTextureFormatInfo(&local_70,(TextureFormat *)&this_00->m_refTexture);
      tcu::Texture2D::allocLevel(&local_80->m_refTexture,0);
      tcu::fillWithComponentGradients
                ((local_80->m_refTexture).super_TextureLevelPyramid.m_access.
                 super__Vector_base<tcu::PixelBufferAccess,_std::allocator<tcu::PixelBufferAccess>_>
                 ._M_impl.super__Vector_impl_data._M_start,&local_70.valueMin,&local_70.valueMax);
      (**(code **)(lVar3 + 8))(iVar2 + 0x84c0);
      (**(code **)(lVar3 + 0xb8))(0xde1,local_80->m_glTexture);
      (**(code **)(lVar3 + 0x1360))(0xde1,0x2801,0x2600);
      (**(code **)(lVar3 + 0x1360))(0xde1,0x2800,0x2600);
      (**(code **)(lVar3 + 0x1360))(0xde1,0x2802,0x812f);
      (**(code **)(lVar3 + 0x1360))(0xde1,0x2803,0x812f);
      (*local_80->_vptr_Texture2D[2])();
      __position._M_current =
           (this->m_textures).
           super__Vector_base<glu::Texture2D_*,_std::allocator<glu::Texture2D_*>_>._M_impl.
           super__Vector_impl_data._M_finish;
      if (__position._M_current ==
          (this->m_textures).super__Vector_base<glu::Texture2D_*,_std::allocator<glu::Texture2D_*>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage) {
        std::vector<glu::Texture2D*,std::allocator<glu::Texture2D*>>::
        _M_realloc_insert<glu::Texture2D*const&>(local_78,__position,&local_80);
      }
      else {
        *__position._M_current = local_80;
        pppTVar1 = &(this->m_textures).
                    super__Vector_base<glu::Texture2D_*,_std::allocator<glu::Texture2D_*>_>._M_impl.
                    super__Vector_impl_data._M_finish;
        *pppTVar1 = *pppTVar1 + 1;
      }
      iVar2 = iVar2 + 1;
    } while (iVar2 < this->m_numLookups);
  }
  iVar2 = ShaderCompilerCase::init
                    (&this->super_ShaderCompilerCase,(EVP_PKEY_CTX *)__position._M_current);
  return iVar2;
}

Assistant:

void ShaderCompilerTextureCase::init (void)
{
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	// Setup texture.

	DE_ASSERT(m_textures.empty());

	m_textures.reserve(m_numLookups);

	for (int i = 0; i < m_numLookups; i++)
	{
		glu::Texture2D*			tex		= new glu::Texture2D(m_context.getRenderContext(), GL_RGB, GL_UNSIGNED_BYTE, TEXTURE_WIDTH, TEXTURE_HEIGHT);
		tcu::TextureFormatInfo	fmtInfo	= tcu::getTextureFormatInfo(tex->getRefTexture().getFormat());

		tex->getRefTexture().allocLevel(0);
		tcu::fillWithComponentGradients(tex->getRefTexture().getLevel(0), fmtInfo.valueMin, fmtInfo.valueMax);

		gl.activeTexture(GL_TEXTURE0 + i);
		gl.bindTexture(GL_TEXTURE_2D, tex->getGLTexture());
		gl.texParameteri(GL_TEXTURE_2D, GL_TEXTURE_MIN_FILTER, GL_NEAREST);
		gl.texParameteri(GL_TEXTURE_2D, GL_TEXTURE_MAG_FILTER, GL_NEAREST);
		gl.texParameteri(GL_TEXTURE_2D, GL_TEXTURE_WRAP_S, GL_CLAMP_TO_EDGE);
		gl.texParameteri(GL_TEXTURE_2D, GL_TEXTURE_WRAP_T, GL_CLAMP_TO_EDGE);
		tex->upload();

		m_textures.push_back(tex);
	}

	ShaderCompilerCase::init();
}